

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

void __thiscall Assimp::glTFExporter::ExportMetadata(glTFExporter *this)

{
  element_type *peVar1;
  aiMetadata *paVar2;
  uint *puVar3;
  long *plVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  aiMetadata *paVar9;
  aiMetadata *paVar10;
  char *pcVar11;
  size_t __n;
  ulong __n_00;
  long lVar12;
  bool bVar13;
  aiString copyright_str;
  char buffer [256];
  long *local_960;
  ulong local_958;
  long local_950 [2];
  uint local_93c;
  char local_938 [1024];
  char local_538 [264];
  undefined1 local_430 [1024];
  
  peVar1 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_replace
            ((ulong)&(peVar1->asset).version,0,(char *)(peVar1->asset).version._M_string_length,
             0x6aca06);
  uVar5 = aiGetVersionMajor();
  uVar6 = aiGetVersionMinor();
  uVar7 = aiGetVersionRevision();
  snprintf(local_538,0x100,"Open Asset Import Library (assimp v%d.%d.%d)",(ulong)uVar5,(ulong)uVar6,
           (ulong)uVar7);
  pcVar11 = (char *)(peVar1->asset).generator._M_string_length;
  strlen(local_538);
  std::__cxx11::string::_M_replace((ulong)&(peVar1->asset).generator,0,pcVar11,(ulong)local_538);
  local_93c = 0;
  local_938[0] = '\0';
  memset(local_938 + 1,0x1b,0x3ff);
  bVar13 = false;
  paVar2 = this->mScene->mMetaData;
  local_960 = local_950;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"SourceAsset_Copyright","");
  plVar4 = local_960;
  __n = 0x3ff;
  if ((local_958 & 0xfffffc00) == 0) {
    __n = local_958 & 0xffffffff;
  }
  memcpy(local_430,local_960,__n);
  local_430[__n] = 0;
  paVar9 = (aiMetadata *)(ulong)paVar2->mNumProperties;
  paVar10 = paVar2;
  if (paVar9 != (aiMetadata *)0x0) {
    pcVar11 = paVar2->mKeys->data;
    bVar13 = true;
    paVar10 = (aiMetadata *)0x1;
    lVar12 = 0;
    do {
      if ((((aiString *)(pcVar11 + -4))->length == (ai_uint32)__n) &&
         (iVar8 = bcmp(pcVar11,local_430,__n), iVar8 == 0)) {
        if (*(int *)((long)&paVar2->mValues->mType + lVar12) == 5) {
          puVar3 = *(uint **)((long)&paVar2->mValues->mData + lVar12);
          paVar10 = (aiMetadata *)0x1;
          if (puVar3 != &local_93c) {
            local_93c = *puVar3;
            __n_00 = (ulong)local_93c;
            memcpy(local_938,puVar3 + 1,__n_00);
            local_938[__n_00] = '\0';
          }
        }
        else {
          paVar10 = (aiMetadata *)0x0;
        }
        goto LAB_0035d035;
      }
      bVar13 = paVar10 < paVar9;
      lVar12 = lVar12 + 0x10;
      paVar10 = (aiMetadata *)((long)&paVar10->mNumProperties + 1);
      pcVar11 = pcVar11 + 0x404;
    } while ((long)paVar9 << 4 != lVar12);
    bVar13 = false;
  }
LAB_0035d035:
  if (plVar4 != local_950) {
    operator_delete(plVar4,local_950[0] + 1);
  }
  if ((bVar13 & (byte)paVar10) != 0) {
    pcVar11 = (char *)(peVar1->asset).copyright._M_string_length;
    strlen(local_938);
    std::__cxx11::string::_M_replace((ulong)&peVar1->asset,0,pcVar11,(ulong)local_938);
  }
  return;
}

Assistant:

void glTFExporter::ExportMetadata()
{
    glTF::AssetMetadata& asset = mAsset->asset;
    asset.version = "1.0";

    char buffer[256];
    ai_snprintf(buffer, 256, "Open Asset Import Library (assimp v%d.%d.%d)",
        aiGetVersionMajor(), aiGetVersionMinor(), aiGetVersionRevision());

    asset.generator = buffer;

	// Copyright
	aiString copyright_str;
	if (mScene->mMetaData->Get(AI_METADATA_SOURCE_COPYRIGHT, copyright_str)) {
		asset.copyright = copyright_str.C_Str();
	}
}